

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

void __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::buffered_reader(buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                  *this,buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                        *other)

{
  pointer puVar1;
  storage_type<pstore::gsl::details::extent_type<_1L>_> sVar2;
  span<unsigned_char,__1L> sStack_38;
  
  puVar1 = (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->refill_ = other->refill_;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  puVar1 = (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (other->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
          pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&this->buf_);
  (this->span_).storage_ = sVar2;
  pstore::gsl::span<unsigned_char,_-1L>::begin(&sStack_38);
  pos(other,&other->pos_);
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
            (&this->pos_,(difference_type)&sStack_38);
  pstore::gsl::span<unsigned_char,_-1L>::begin(&sStack_38);
  pos(other,&other->end_);
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
            (&this->end_,(difference_type)&sStack_38);
  this->is_eof_ = other->is_eof_;
  maybe<unsigned_char,_void>::maybe(&this->push_,&other->push_);
  check_invariants(this);
  return;
}

Assistant:

buffered_reader<IO, RefillFunction>::buffered_reader (buffered_reader && other) noexcept
                : refill_ (std::move (other.refill_))
                , buf_{std::move (other.buf_)}
                , span_{gsl::make_span (buf_)}
                , pos_{span_.begin () + other.pos (other.pos_)}
                , end_{span_.begin () + other.pos (other.end_)}
                , is_eof_{other.is_eof_}
                , push_{std::move (other.push_)} {
            this->check_invariants ();
        }